

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O2

UBool __thiscall icu_63::ResourceDataValue::isNoInheritanceMarker(ResourceDataValue *this)

{
  uint uVar1;
  ResourceData *pRVar2;
  int32_t *piVar3;
  uint16_t uVar4;
  int iVar5;
  uint uVar6;
  uint16_t *puVar7;
  uint16_t **ppuVar8;
  ulong uVar9;
  
  uVar1 = this->res;
  uVar9 = (ulong)uVar1;
  uVar6 = uVar1 & 0xfffffff;
  if (uVar6 == 0) {
    return '\0';
  }
  pRVar2 = this->pResData;
  if (uVar1 < 0x10000000) {
    piVar3 = pRVar2->pRoot;
    if (piVar3[uVar9] != 3) {
      return '\0';
    }
    if ((short)piVar3[uVar9 + 1] != 0x2205) {
      return '\0';
    }
    if (*(short *)((long)piVar3 + uVar9 * 4 + 6) != 0x2205) {
      return '\0';
    }
    puVar7 = (uint16_t *)(piVar3 + uVar9 + 2);
  }
  else {
    iVar5 = 0;
    if ((uVar1 & 0xf0000000) != 0x60000000) {
      return '\0';
    }
    ppuVar8 = &pRVar2->poolBundleStrings;
    if (pRVar2->poolStringIndexLimit <= (int)uVar6) {
      ppuVar8 = &pRVar2->p16BitUnits;
      iVar5 = pRVar2->poolStringIndexLimit;
    }
    puVar7 = *ppuVar8 + (uVar6 - iVar5);
    if (*puVar7 != 0xdc03) {
      if (*puVar7 != 0x2205) {
        return '\0';
      }
      if (puVar7[1] != 0x2205) {
        return '\0';
      }
      if (puVar7[2] != 0x2205) {
        return '\0';
      }
      puVar7 = puVar7 + 3;
      uVar4 = 0;
      goto LAB_002bc82b;
    }
    if (puVar7[1] != 0x2205) {
      return '\0';
    }
    if (puVar7[2] != 0x2205) {
      return '\0';
    }
    puVar7 = puVar7 + 3;
  }
  uVar4 = 0x2205;
LAB_002bc82b:
  return *puVar7 == uVar4;
}

Assistant:

UBool ResourceDataValue::isNoInheritanceMarker() const {
    return ::isNoInheritanceMarker(pResData, res);
}